

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDFastPFor<8U>::__encodeArray
          (SIMDFastPFor<8U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  undefined4 *puVar2;
  pointer pvVar3;
  long lVar4;
  iterator __position;
  bool bVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  SIMDFastPFor<8U> *pSVar8;
  uint32_t *puVar9;
  long lVar10;
  ulong uVar11;
  uint bit;
  uint32_t bit_00;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *this_00;
  uint32_t k;
  byte *__src;
  __m128i *out_00;
  bool bVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  undefined1 auVar18 [32];
  undefined1 auVar16 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  byte local_6b;
  byte local_6a;
  byte local_69;
  uint32_t *local_68;
  uint local_5c;
  uint32_t *local_58;
  size_t *local_50;
  uint32_t *local_48;
  SIMDFastPFor<8U> *local_40;
  uint32_t *local_38;
  undefined1 auVar20 [32];
  undefined1 auVar17 [32];
  undefined1 auVar19 [32];
  undefined1 auVar27 [64];
  
  local_68 = out;
  checkifdivisibleby(length,0x100);
  auVar19 = in_ZMM6._0_32_;
  pvVar3 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = 8;
  do {
    lVar4 = *(long *)((long)pvVar3 + lVar10 + -8);
    if (*(long *)((long)&(pvVar3->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data + lVar10) != lVar4) {
      *(long *)((long)&(pvVar3->
                       super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                       )._M_impl.super__Vector_impl_data + lVar10) = lVar4;
    }
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 800);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  out_00 = (__m128i *)(local_68 + 1);
  pbVar14 = __src;
  if (0xff < (long)length) {
    local_48 = in + length;
    puVar9 = in + 0x100;
    local_50 = nvalue;
    local_40 = this;
    do {
      pSVar8 = local_40;
      local_38 = puVar9;
      getBestBFromData(local_40,in,&local_6b,&local_69,&local_6a);
      bVar7 = local_6b;
      *pbVar14 = local_6b;
      pbVar14[1] = local_69;
      local_58 = in;
      if (local_69 == 0) {
        pbVar14 = pbVar14 + 2;
      }
      else {
        pbVar14[2] = local_6a;
        pbVar14 = pbVar14 + 3;
        this_00 = (pSVar8->datatobepacked).
                  super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((ulong)local_6a - (ulong)local_6b);
        lVar10 = 0;
        do {
          if (in[lVar10] >> (bVar7 & 0x1f) != 0) {
            local_5c = in[lVar10] >> (local_6b & 0x1f);
            __position._M_current =
                 (this_00->
                 super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->
                super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
              _M_realloc_insert<unsigned_int>(this_00,__position,&local_5c);
            }
            else {
              *__position._M_current = local_5c;
              (this_00->
              super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
              )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar14 = (byte)lVar10;
            pbVar14 = pbVar14 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
      }
      bit = (uint)local_6b;
      uVar13 = (ulong)local_6b;
      puVar9 = local_58;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        SIMD_fastpack_32(puVar9,out_00,bit);
        auVar19 = in_ZMM6._0_32_;
        puVar9 = puVar9 + 0x80;
        out_00 = out_00 + uVar13;
        bVar5 = false;
      } while (bVar12);
      puVar9 = local_38 + 0x100;
      in = local_58 + 0x100;
    } while (puVar9 <= local_48);
    __src = (local_40->bytescontainer).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    this = local_40;
    nvalue = local_50;
  }
  puVar9 = (uint32_t *)((long)*out_00 + 4);
  uVar13 = (long)pbVar14 - (long)__src & 0xffffffff;
  *local_68 = (uint32_t)((ulong)((long)out_00 - (long)local_68) >> 2);
  *(uint32_t *)*out_00 = (uint32_t)((long)pbVar14 - (long)__src);
  memcpy(puVar9,__src,uVar13);
  uVar15 = uVar13 + 3 & 0xfffffffffffffffc;
  if (uVar13 < uVar15) {
    uVar1 = (long)*out_00 + uVar13 + 5;
    uVar11 = (long)*out_00 + uVar15 + 4;
    if (uVar11 < uVar1) {
      uVar11 = uVar1;
    }
    memset((void *)((long)puVar9 + uVar13),0,(uVar11 - ((long)*out_00 + uVar13)) - 4);
  }
  auVar20 = vpmovsxbd_avx2(ZEXT816(0x908070605040302));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar23 = vpbroadcastq_avx512f(ZEXT816(0x1f));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar39._16_4_ = 1;
  auVar39._20_4_ = 1;
  auVar39._24_4_ = 1;
  auVar39._28_4_ = 1;
  auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
  auVar40._8_4_ = 8;
  auVar40._0_8_ = 0x800000008;
  auVar40._12_4_ = 8;
  auVar40._16_4_ = 8;
  auVar40._20_4_ = 8;
  auVar40._24_4_ = 8;
  auVar40._28_4_ = 8;
  pvVar3 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (undefined4 *)((long)*out_00 + uVar15 + 4);
  auVar38 = ZEXT1664((undefined1  [16])0x0);
  auVar19 = vpcmpeqd_avx2(auVar19,auVar19);
  lVar10 = 0;
  do {
    auVar26 = vpbroadcastq_avx512f();
    vpmullq_avx512dq(auVar21,auVar24);
    lVar10 = lVar10 + 8;
    auVar21 = vpaddq_avx512f(auVar21,auVar25);
    auVar26 = vporq_avx512f(auVar26,auVar22);
    uVar13 = vpcmpuq_avx512f(auVar26,auVar23,1);
    auVar27 = vpgatherqq_avx512f(*(undefined8 *)((long)*out_00 + (long)pvVar3));
    auVar28._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar27._8_8_;
    auVar28._0_8_ = (ulong)((byte)uVar13 & 1) * auVar27._0_8_;
    auVar28._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar27._16_8_;
    auVar28._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar27._24_8_;
    auVar28._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar27._32_8_;
    auVar28._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar27._40_8_;
    auVar28._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar27._48_8_;
    auVar28._56_8_ = (uVar13 >> 7) * auVar27._56_8_;
    auVar27 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)*out_00 +
                                  (long)((long)&(pvVar3->
                                                super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                                )._M_impl.super__Vector_impl_data + 8U)));
    auVar29._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar27._8_8_;
    auVar29._0_8_ = (ulong)((byte)uVar13 & 1) * auVar27._0_8_;
    auVar29._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar27._16_8_;
    auVar29._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar27._24_8_;
    auVar29._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar27._32_8_;
    auVar29._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar27._40_8_;
    auVar29._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar27._48_8_;
    auVar29._56_8_ = (uVar13 >> 7) * auVar27._56_8_;
    auVar17 = vpaddd_avx2(auVar20,auVar19);
    auVar20 = vpaddd_avx2(auVar40,auVar20);
    auVar17 = vpsllvd_avx2(auVar39,auVar17);
    uVar13 = vpcmpq_avx512f(auVar29,auVar28,4);
    auVar17 = vpord_avx512vl(auVar38._0_32_,auVar17);
    bVar5 = (bool)((byte)uVar13 & 1);
    iVar30 = auVar38._0_4_;
    auVar18._0_4_ = (uint)bVar5 * auVar17._0_4_ | (uint)!bVar5 * iVar30;
    bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
    iVar31 = auVar38._4_4_;
    auVar18._4_4_ = (uint)bVar5 * auVar17._4_4_ | (uint)!bVar5 * iVar31;
    bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
    iVar32 = auVar38._8_4_;
    auVar18._8_4_ = (uint)bVar5 * auVar17._8_4_ | (uint)!bVar5 * iVar32;
    bVar5 = (bool)((byte)(uVar13 >> 3) & 1);
    iVar33 = auVar38._12_4_;
    auVar18._12_4_ = (uint)bVar5 * auVar17._12_4_ | (uint)!bVar5 * iVar33;
    bVar5 = (bool)((byte)(uVar13 >> 4) & 1);
    iVar34 = auVar38._16_4_;
    auVar18._16_4_ = (uint)bVar5 * auVar17._16_4_ | (uint)!bVar5 * iVar34;
    bVar5 = (bool)((byte)(uVar13 >> 5) & 1);
    iVar35 = auVar38._20_4_;
    auVar18._20_4_ = (uint)bVar5 * auVar17._20_4_ | (uint)!bVar5 * iVar35;
    bVar5 = (bool)((byte)(uVar13 >> 6) & 1);
    iVar36 = auVar38._24_4_;
    auVar18._24_4_ = (uint)bVar5 * auVar17._24_4_ | (uint)!bVar5 * iVar36;
    bVar5 = SUB81(uVar13 >> 7,0);
    iVar37 = auVar38._28_4_;
    auVar18._28_4_ = (uint)bVar5 * auVar17._28_4_ | (uint)!bVar5 * iVar37;
    auVar38 = ZEXT3264(auVar18);
  } while (lVar10 != 0x20);
  auVar21._8_8_ = 0x1f;
  auVar21._0_8_ = 0x1f;
  auVar21._16_8_ = 0x1f;
  auVar21._24_8_ = 0x1f;
  auVar21._32_8_ = 0x1f;
  auVar21._40_8_ = 0x1f;
  auVar21._48_8_ = 0x1f;
  auVar21._56_8_ = 0x1f;
  uVar13 = vpcmpuq_avx512f(auVar26,auVar21,1);
  bit_00 = 2;
  lVar10 = 0;
  auVar19 = vmovdqa32_avx512vl(auVar18);
  bVar5 = (bool)((byte)uVar13 & 1);
  auVar16._0_4_ = (uint)bVar5 * auVar19._0_4_ | (uint)!bVar5 * iVar30;
  bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
  auVar16._4_4_ = (uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * iVar31;
  bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
  auVar16._8_4_ = (uint)bVar5 * auVar19._8_4_ | (uint)!bVar5 * iVar32;
  bVar5 = (bool)((byte)(uVar13 >> 3) & 1);
  auVar16._12_4_ = (uint)bVar5 * auVar19._12_4_ | (uint)!bVar5 * iVar33;
  bVar5 = (bool)((byte)(uVar13 >> 4) & 1);
  auVar20._16_4_ = (uint)bVar5 * auVar19._16_4_ | (uint)!bVar5 * iVar34;
  auVar20._0_16_ = auVar16;
  bVar5 = (bool)((byte)(uVar13 >> 5) & 1);
  auVar20._20_4_ = (uint)bVar5 * auVar19._20_4_ | (uint)!bVar5 * iVar35;
  bVar5 = (bool)((byte)(uVar13 >> 6) & 1);
  auVar20._24_4_ = (uint)bVar5 * auVar19._24_4_ | (uint)!bVar5 * iVar36;
  bVar5 = SUB81(uVar13 >> 7,0);
  auVar20._28_4_ = (uint)bVar5 * auVar19._28_4_ | (uint)!bVar5 * iVar37;
  auVar16 = vpor_avx(auVar16,auVar20._16_16_);
  auVar6 = vpshufd_avx(auVar16,0xee);
  auVar16 = vpor_avx(auVar16,auVar6);
  auVar6 = vpshufd_avx(auVar16,0x55);
  auVar16 = vpor_avx(auVar16,auVar6);
  *puVar2 = auVar16._0_4_;
  puVar9 = puVar2 + 1;
  do {
    pvVar3 = (this->datatobepacked).
             super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&pvVar3[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar10 + 8) !=
        *(long *)((long)&pvVar3[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar10)) {
      puVar9 = SIMDFastPFor<8u>::
               packmeupwithoutmasksimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                         ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                           *)((long)&pvVar3[2].
                                     super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                     ._M_impl.super__Vector_impl_data + lVar10),puVar9,bit_00);
    }
    bit_00 = bit_00 + 1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x2e8);
  *nvalue = (long)puVar9 - (long)local_68 >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    for (uint32_t k = 0; k < 32 + 1; ++k)
      datatobepacked[k].clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<uint32_t, cacheallocator> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockupsimd(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    uint32_t bitmap = 0;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() != 0)
        bitmap |= (1U << (k - 1));
    }
    *(out++) = bitmap;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() > 0)
        out = packmeupwithoutmasksimd(datatobepacked[k], out, k);
    }
    nvalue = out - initout;
  }